

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O3

int __thiscall P_QReset::match(P_QReset *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  pointer pSVar2;
  iterator __position;
  int local_c;
  
  pSVar2 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c = 0;
  __position._M_current =
       pSVar2[-1].st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      pSVar2[-1].st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&pSVar2[-1].st.qcount,__position,&local_c);
  }
  else {
    *__position._M_current = 0;
    pSVar2[-1].st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  piVar1 = &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
            super__Vector_impl_data._M_finish[-1].iseq;
  *piVar1 = *piVar1 + 1;
  return 0;
}

Assistant:

int P_QReset::match(vector<StateP> &stk) {
    stk.back().st.qcount.push_back(0);
    stk.back().iseq++;
    return 0;
}